

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

void __thiscall
Memory::HeapBlockMap64::VerifyMarkCountForPages<256u>
          (HeapBlockMap64 *this,void *address,uint pageCount)

{
  uint extraout_EDX;
  Node *pNVar1;
  
  for (pNVar1 = this->list; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
    if (pNVar1->nodeIndex == (uint)((ulong)address >> 0x20)) goto LAB_006b7e91;
  }
  VerifyMarkCountForPages<256u>();
  pageCount = extraout_EDX;
LAB_006b7e91:
  HeapBlockMap32::VerifyMarkCountForPages<256u>(&pNVar1->map,address,pageCount);
  return;
}

Assistant:

void
HeapBlockMap64::VerifyMarkCountForPages(void * address, uint pageCount)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);

    node->map.VerifyMarkCountForPages<BitVectorCount>(address, pageCount);
}